

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

int anm_is_valid_script_index(anm_archive_t *anm,int32_t index)

{
  undefined8 *local_40;
  list_node_t *node_1;
  list_node_t *node;
  anm_script_t *script;
  anm_entry_t *entry;
  int32_t index_local;
  anm_archive_t *anm_local;
  
  node_1 = (anm->entries).head;
  do {
    if (node_1 == (list_node_t *)0x0) {
      return 0;
    }
    for (local_40 = *(undefined8 **)((long)node_1->data + 0x48); local_40 != (undefined8 *)0x0;
        local_40 = (undefined8 *)*local_40) {
      if (*(int *)local_40[2] == index) {
        return 1;
      }
    }
    node_1 = node_1->next;
  } while( true );
}

Assistant:

static int
anm_is_valid_script_index(
    const anm_archive_t* anm,
    int32_t index
) {
    anm_entry_t* entry;
    anm_script_t* script;
    list_for_each(&anm->entries, entry) {
        list_for_each(&entry->scripts, script) {
            if (script->real_index == index)
                return 1;
        }
    }
    return 0;
}